

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint64_t helper_macmuls_m68k(CPUM68KState_conflict *env,uint32_t op1,uint32_t op2)

{
  uint64_t uVar1;
  uint64_t local_28;
  int64_t res;
  int64_t product;
  uint32_t op2_local;
  uint32_t op1_local;
  CPUM68KState_conflict *env_local;
  
  uVar1 = (ulong)op1 * (ulong)op2;
  local_28 = (long)(uVar1 * 0x1000000) >> 0x18;
  if ((local_28 != uVar1) && (env->macsr = env->macsr | 2, (env->macsr & 0x80) != 0)) {
    if ((long)uVar1 < 0) {
      local_28 = 0xfffbffffffffffff;
    }
    else {
      local_28 = 0x4000000000000;
    }
  }
  return local_28;
}

Assistant:

uint64_t HELPER(macmuls)(CPUM68KState *env, uint32_t op1, uint32_t op2)
{
    int64_t product;
    int64_t res;

    product = (uint64_t)op1 * op2;
    res = (product << 24) >> 24;
    if (res != product) {
        env->macsr |= MACSR_V;
        if (env->macsr & MACSR_OMC) {
            /* Make sure the accumulate operation overflows.  */
            if (product < 0)
                res = ~(1ll << 50);
            else
                res = 1ll << 50;
        }
    }
    return res;
}